

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O0

TestAllTypes_NestedMessage * __thiscall
proto2_unittest::TestAllTypes::_internal_mutable_oneof_lazy_nested_message(TestAllTypes *this)

{
  OneofFieldCase OVar1;
  Arena *arena;
  TestAllTypes_NestedMessage *pTVar2;
  TestAllTypes *this_local;
  
  OVar1 = oneof_field_case(this);
  if (OVar1 != kOneofLazyNestedMessage) {
    clear_oneof_field(this);
    set_has_oneof_lazy_nested_message(this);
    arena = google::protobuf::MessageLite::GetArena((MessageLite *)this);
    pTVar2 = (TestAllTypes_NestedMessage *)
             google::protobuf::Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>
                       (arena);
    (this->field_0)._impl_.oneof_field_.oneof_nested_message_ = pTVar2;
  }
  return (this->field_0)._impl_.oneof_field_.oneof_nested_message_;
}

Assistant:

TestAllTypes::_internal_mutable_oneof_lazy_nested_message() {
  if (oneof_field_case() != kOneofLazyNestedMessage) {
    clear_oneof_field();
    set_has_oneof_lazy_nested_message();
    _impl_.oneof_field_.oneof_lazy_nested_message_ = 
        ::google::protobuf::Message::DefaultConstruct<::proto2_unittest::TestAllTypes_NestedMessage>(GetArena());
  }
  return _impl_.oneof_field_.oneof_lazy_nested_message_;
}